

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_complex_asin(sexp ctx,sexp z)

{
  sexp psVar1;
  sexp tmp2;
  sexp tmp;
  sexp_gc_var_t local_68;
  sexp local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_50.var = &tmp2;
  local_68.var = &local_58;
  local_58 = (sexp)0x43e;
  local_40.var = &tmp;
  tmp = (sexp)&DAT_0000043e;
  tmp2 = (sexp)&DAT_0000043e;
  local_40.next = &local_68;
  local_68.next = (ctx->value).context.saves;
  local_50.next = &local_40;
  (ctx->value).context.saves = &local_50;
  local_58 = sexp_complex_mul(ctx,z,z);
  local_58 = sexp_sub(ctx,(sexp)&DAT_00000003,local_58);
  local_58 = sexp_sqrt(ctx,(sexp)0x0,1,local_58);
  tmp = sexp_make_complex(ctx,(sexp)&DAT_00000001,(sexp)&DAT_00000001);
  psVar1 = sexp_mul(ctx,(sexp)0xffffffffffffffff,(z->value).type.cpl);
  (tmp->value).type.name = psVar1;
  (tmp->value).type.cpl = (sexp)(z->value).flonum;
  local_58 = sexp_add(ctx,tmp,local_58);
  local_58 = sexp_log(ctx,(sexp)0x0,1,local_58);
  tmp = sexp_make_complex(ctx,(sexp)&DAT_00000001,(sexp)0xffffffffffffffff);
  psVar1 = sexp_mul(ctx,local_58,tmp);
  (ctx->value).context.saves = local_68.next;
  return psVar1;
}

Assistant:

sexp sexp_complex_asin (sexp ctx, sexp z) {
  sexp_gc_var3(res, tmp, tmp2);
  sexp_gc_preserve3(ctx, res, tmp, tmp2);
  res = sexp_complex_mul(ctx, z, z);
  res = sexp_sub(ctx, SEXP_ONE, res);
  res = sexp_sqrt(ctx, NULL, 1, res);
  tmp = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
  sexp_complex_real(tmp) = sexp_mul(ctx, SEXP_NEG_ONE, sexp_complex_imag(z));
  sexp_complex_imag(tmp) = sexp_complex_real(z);
  res = sexp_add(ctx, tmp, res);
  res = sexp_log(ctx, NULL, 1, res);
  tmp = sexp_make_complex(ctx, SEXP_ZERO, SEXP_NEG_ONE);
  res = sexp_mul(ctx, res, tmp);
  sexp_gc_release3(ctx);
  return res;
}